

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O1

int main(void)

{
  long *plVar1;
  int x2;
  int x1;
  int local_30;
  int local_2c;
  
  std::istream::operator>>((istream *)&std::cin,&local_2c);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_2c);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::istream::operator>>((istream *)&std::cin,&local_30);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_30);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ans=",4);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_30 + local_2c);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main(){
    int x1,x2,gou;
    std::cin >> x1;
    std::cout << x1 << std::endl;

    std::cin >> x2;
    std::cout << x2 << std::endl;

    gou = sum(x1,x2);

    std::cout << "ans=" << gou << std::endl;
    return 0;
}